

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O0

void soplex::MPSreadRows(MPSInput *mps,
                        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *rset,NameSet *rnames,SPxOut *spxout)

{
  char cVar1;
  bool bVar2;
  Verbosity VVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  double *pdVar7;
  SPxOut *in_RCX;
  MPSInput *in_RDI;
  Verbosity old_verbosity;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  row;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_fffffffffffffb68;
  undefined2 in_stack_fffffffffffffb70;
  undefined6 in_stack_fffffffffffffb72;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *in_stack_fffffffffffffb78;
  NameSet *in_stack_fffffffffffffb80;
  undefined8 in_stack_fffffffffffffbb8;
  MPSInput *in_stack_fffffffffffffbc0;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffffbc8;
  MPSInput *in_stack_fffffffffffffc08;
  undefined4 local_3ec;
  undefined1 local_3e8 [8];
  longdouble in_stack_fffffffffffffc20;
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  *in_stack_fffffffffffffc38;
  double local_3a0;
  NameSet local_398;
  undefined4 local_220;
  undefined4 local_21c;
  Verbosity local_218 [62];
  SPxOut *local_120;
  MPSInput *local_108;
  undefined8 local_f0;
  double *local_e8;
  int *local_e0;
  undefined8 local_c8;
  double *local_c0;
  NameSet *local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined1 *local_a0;
  Real *local_98;
  undefined8 local_90;
  undefined8 local_88;
  int *local_80;
  int *local_78;
  undefined8 local_70;
  undefined8 local_68;
  int *local_60;
  _func_int_Name_ptr **local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined4 *local_40;
  undefined1 *local_38;
  undefined4 *local_30;
  int *local_28;
  int *local_20;
  undefined1 *local_18;
  double *local_10;
  double *local_8;
  
  local_120 = in_RCX;
  local_108 = in_RDI;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               *)in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20));
  do {
    bVar2 = MPSInput::readLine(in_stack_fffffffffffffc08);
    if (!bVar2) {
LAB_001a9b07:
      MPSInput::syntaxError
                ((MPSInput *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70));
      local_220 = 0;
LAB_001a9b21:
      LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70));
      return;
    }
    pcVar5 = MPSInput::field0(local_108);
    if (pcVar5 != (char *)0x0) {
      if ((local_120 != (SPxOut *)0x0) && (VVar3 = SPxOut::getVerbosity(local_120), 3 < (int)VVar3))
      {
        local_218[0] = SPxOut::getVerbosity(local_120);
        local_21c = 4;
        (*local_120->_vptr_SPxOut[2])(local_120,&local_21c);
        operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                   (char *)in_stack_fffffffffffffb68);
        MPSInput::objName(local_108);
        operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                   (char *)in_stack_fffffffffffffb68);
        operator<<((SPxOut *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffffb68);
        (*local_120->_vptr_SPxOut[2])(local_120,local_218);
      }
      pcVar5 = MPSInput::field0(local_108);
      iVar4 = strcmp(pcVar5,"COLUMNS");
      if (iVar4 == 0) {
        MPSInput::setSection(local_108,COLUMNS);
        local_220 = 1;
        goto LAB_001a9b21;
      }
      goto LAB_001a9b07;
    }
    pcVar5 = MPSInput::field1(local_108);
    if (*pcVar5 == 'N') {
      pcVar5 = MPSInput::objName(local_108);
      if (*pcVar5 == '\0') {
        in_stack_fffffffffffffbc0 = local_108;
        in_stack_fffffffffffffbc8 =
             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
              *)MPSInput::field2(local_108);
        MPSInput::setObjName
                  ((MPSInput *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                   (char *)in_stack_fffffffffffffb68);
      }
    }
    else {
      pcVar5 = MPSInput::field2(local_108);
      bVar2 = NameSet::has(in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78);
      if (bVar2) goto LAB_001a9b07;
      MPSInput::field2(local_108);
      NameSet::add(in_stack_fffffffffffffb80,(char *)in_stack_fffffffffffffb78);
      pcVar6 = MPSInput::field1(local_108);
      cVar1 = *pcVar6;
      if (cVar1 == 'E') {
        local_398.hashtab.primes[0xf] = 0;
        local_78 = local_398.hashtab.primes + 0x10;
        local_80 = local_398.hashtab.primes + 0xf;
        local_88 = 0;
        local_90 = 0;
        local_20 = local_80;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  (in_stack_fffffffffffffbc8,(longlong *)in_stack_fffffffffffffbc0,pcVar5);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1a980c);
        local_398.hashtab.m_used = 0;
        local_58 = &local_398.hashtab.m_hashfun;
        local_60 = &local_398.hashtab.m_used;
        local_68 = 0;
        local_70 = 0;
        local_28 = local_60;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  (in_stack_fffffffffffffbc8,(longlong *)in_stack_fffffffffffffbc0,pcVar5);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1a98a7);
      }
      else if (cVar1 == 'G') {
        local_398.hashtab._252_4_ = 0;
        local_98 = &local_398.factor;
        local_a0 = &local_398.hashtab.field_0xfc;
        local_a8 = 0;
        local_b0 = 0;
        local_18 = local_a0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  (in_stack_fffffffffffffbc8,(longlong *)in_stack_fffffffffffffbc0,pcVar5);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1a9657);
        local_e8 = (double *)infinity();
        local_e0 = local_398.hashtab.primes + 0x20;
        local_f0 = 0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)0x1a9692);
        local_8 = local_e8;
        in_stack_fffffffffffffb68 = SUB108((longdouble)*local_e8,0);
        in_stack_fffffffffffffb70 = (undefined2)((unkuint10)(longdouble)*local_e8 >> 0x40);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=(in_stack_fffffffffffffc38,in_stack_fffffffffffffc20);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1a9720);
      }
      else {
        if (cVar1 != 'L') {
          MPSInput::syntaxError
                    ((MPSInput *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70));
          local_220 = 1;
          goto LAB_001a9b21;
        }
        pdVar7 = (double *)infinity();
        local_3a0 = -*pdVar7;
        in_stack_fffffffffffffb80 = &local_398;
        local_c0 = &local_3a0;
        local_c8 = 0;
        local_b8 = in_stack_fffffffffffffb80;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                            *)0x1a9953);
        local_10 = local_c0;
        in_stack_fffffffffffffb68 = SUB108((longdouble)*local_c0,0);
        in_stack_fffffffffffffb70 = (undefined2)((unkuint10)(longdouble)*local_c0 >> 0x40);
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
        ::operator=(in_stack_fffffffffffffc38,in_stack_fffffffffffffc20);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::setLhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1a99e7);
        local_3ec = 0;
        local_38 = local_3e8;
        local_40 = &local_3ec;
        local_48 = 0;
        local_50 = 0;
        local_30 = local_40;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  (in_stack_fffffffffffffbc8,(longlong *)in_stack_fffffffffffffbc0,pcVar5);
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::setRhs((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)CONCAT62(in_stack_fffffffffffffb72,in_stack_fffffffffffffb70),
                 in_stack_fffffffffffffb68);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1a9a82);
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::add((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    }
  } while( true );
}

Assistant:

static void MPSreadRows(MPSInput& mps, LPRowSetBase<Rational>& rset, NameSet& rnames,
                        SPxOut* spxout)
{
   LPRowBase<Rational> row;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD02 Objective name : " << mps.objName() << std::endl;)

         if(strcmp(mps.field0(), "COLUMNS"))
            break;

         mps.setSection(MPSInput::COLUMNS);

         return;
      }

      if(*mps.field1() == 'N')
      {
         if(*mps.objName() == '\0')
            mps.setObjName(mps.field2());
      }
      else
      {
         if(rnames.has(mps.field2()))
            break;

         rnames.add(mps.field2());

         switch(*mps.field1())
         {
         case 'G':
            row.setLhs(0);
            row.setRhs(infinity);
            break;

         case 'E':
            row.setLhs(0);
            row.setRhs(0);
            break;

         case 'L':
            row.setLhs(-infinity);
            row.setRhs(0);
            break;

         default:
            mps.syntaxError();
            return;
         }

         rset.add(row);
      }

      assert((*mps.field1() == 'N') || (rnames.number(mps.field2()) == rset.num() - 1));
   }

   mps.syntaxError();
}